

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::getInputs
          (ShaderAtomicAddCase *this,int numValues,int stride,void *inputs)

{
  deUint32 dVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Random rnd;
  deRandom local_40;
  
  dVar1 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar1);
  if (0 < numValues) {
    uVar4 = 0x1f;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
      uVar4 = 1;
    }
    uVar2 = (ulong)(uint)numValues;
    iVar3 = 0;
    do {
      dVar1 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)inputs + (long)iVar3) = (dVar1 & uVar4) + 1;
      iVar3 = iVar3 + stride;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const int	maxVal		= m_precision == PRECISION_LOWP ? 2 : 32;
		const int	minVal		= 1;

		// \todo [2013-09-04 pyry] Negative values!

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}